

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O2

config_item * servers_init_cb(uint count)

{
  ulong __nmemb;
  config_item *pcVar1;
  config_item *pcVar2;
  config_item *items;
  long lVar3;
  
  __nmemb = (ulong)count;
  free(g_svr_cfg);
  g_svr_cfg = (server_info *)calloc(__nmemb,0xe8);
  g_svr_count = count;
  pcVar1 = (config_item *)calloc(__nmemb,0xc0);
  if (pcVar1 != (config_item *)0x0) {
    items = pcVar1;
    for (lVar3 = 0; __nmemb * 0xe8 - lVar3 != 0; lVar3 = lVar3 + 0xe8) {
      memcpy(items,svritems,0xc0);
      pcVar2 = cfg_find_item("ip_port",items);
      if (pcVar2 != (config_item *)0x0) {
        pcVar2->value = (g_svr_cfg->addr).__ss_padding + lVar3 + -0x12;
      }
      pcVar2 = cfg_find_item("force_edns",items);
      if (pcVar2 != (config_item *)0x0) {
        pcVar2->value = (g_svr_cfg->addr).__ss_padding + lVar3 + -10;
      }
      pcVar2 = cfg_find_item("hijack_threshold",items);
      if (pcVar2 != (config_item *)0x0) {
        pcVar2->value = (g_svr_cfg->addr).__ss_padding + lVar3 + -8;
      }
      items = items + 3;
    }
  }
  return pcVar1;
}

Assistant:

config_item * servers_init_cb(unsigned int count)
{
    void * tmp;
    config_item * items;
    unsigned int i;

    if (g_svr_cfg) {
        free(g_svr_cfg);
        g_svr_cfg = NULL;
        g_svr_count = 0;
    }
    g_svr_cfg = calloc(count, sizeof(* g_svr_cfg));
    g_svr_count = count;

    tmp = calloc(count, sizeof(svritems));
    items = (config_item *)tmp;
    if (tmp){
        for (i = 0; i < count; i++) {
            memcpy(tmp, &svritems[0], sizeof(svritems));
            // Do additional initialization for each item
            config_item * v = cfg_find_item("ip_port", tmp);
            if (v)
                v->value = &g_svr_cfg[i].ip_port;
            v = cfg_find_item("force_edns", tmp);
            if (v) {
                v->value = &g_svr_cfg[i].force_edns;
            }
            v = cfg_find_item("hijack_threshold", tmp);
            if (v) {
                v->value = &g_svr_cfg[i].hijack_threshold;
            }
            tmp += sizeof(svritems);
        }
    }
    return items;
}